

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XAtlas_wrap.cxx
# Opt level: O1

uint CSharp_XAtlasSharp_PackOptions_BruteForce_get(void *jarg1)

{
  return (uint)*(byte *)((long)jarg1 + 0x12);
}

Assistant:

SWIGEXPORT unsigned int SWIGSTDCALL CSharp_XAtlasSharp_PackOptions_BruteForce_get(void * jarg1) {
  unsigned int jresult ;
  xatlas::PackOptions *arg1 = (xatlas::PackOptions *) 0 ;
  bool result;
  
  arg1 = (xatlas::PackOptions *)jarg1; 
  result = (bool) ((arg1)->bruteForce);
  jresult = result; 
  return jresult;
}